

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HomeChecker.cpp
# Opt level: O2

bool __thiscall
tiger::trains::ai::HomeChecker::needHome
          (HomeChecker *this,Train *train,int len,int homeLen,GoodType type)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  Player *this_00;
  Town *pTVar5;
  bool bVar6;
  _Rb_tree<tiger::trains::world::Train_const*,tiger::trains::world::Train_const*,std::_Identity<tiger::trains::world::Train_const*>,std::less<tiger::trains::world::Train_const*>,std::allocator<tiger::trains::world::Train_const*>>
  *this_01;
  double dVar7;
  Train *local_50;
  _Rb_tree<tiger::trains::world::Train_const*,tiger::trains::world::Train_const*,std::_Identity<tiger::trains::world::Train_const*>,std::less<tiger::trains::world::Train_const*>,std::allocator<tiger::trains::world::Train_const*>>
  *local_48;
  Town *local_40;
  double local_38;
  
  local_50 = train;
  iVar1 = world::Train::getGoods(train);
  if (iVar1 == 0) {
LAB_0016608c:
    bVar6 = false;
  }
  else {
    this_01 = (_Rb_tree<tiger::trains::world::Train_const*,tiger::trains::world::Train_const*,std::_Identity<tiger::trains::world::Train_const*>,std::less<tiger::trains::world::Train_const*>,std::allocator<tiger::trains::world::Train_const*>>
               *)&this->goingHomeTrain;
    sVar4 = std::
            set<const_tiger::trains::world::Train_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<const_tiger::trains::world::Train_*>_>
            ::count((set<const_tiger::trains::world::Train_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<const_tiger::trains::world::Train_*>_>
                     *)this_01,&local_50);
    bVar6 = true;
    if (sVar4 != 0) {
      return true;
    }
    this_00 = world::Train::getPlayer(local_50);
    pTVar5 = (Town *)world::Player::getHome(this_00);
    local_40 = pTVar5;
    if (type == PRODUCT) {
      local_48 = this_01;
      iVar1 = world::Town::getProduct(pTVar5);
      local_38 = (double)len;
      dVar7 = ceil(this->dec_product * local_38);
      this_01 = local_48;
      iVar2 = world::Town::getPopulation(pTVar5);
      iVar3 = world::Train::getGoods(local_50);
      pTVar5 = local_40;
      if (len <= (iVar1 - (int)dVar7) / iVar2) {
        iVar1 = world::Town::predictProduct(local_40,homeLen);
        dVar7 = ceil(local_38 * this->dec_product);
        this_01 = local_48;
        iVar2 = world::Town::getProductCapacity(pTVar5);
        if ((iVar1 + iVar3) - (int)dVar7 <= iVar2) goto LAB_0016608c;
      }
    }
    else {
      iVar1 = world::Town::getArrmor(pTVar5);
      local_48 = (_Rb_tree<tiger::trains::world::Train_const*,tiger::trains::world::Train_const*,std::_Identity<tiger::trains::world::Train_const*>,std::less<tiger::trains::world::Train_const*>,std::allocator<tiger::trains::world::Train_const*>>
                  *)this->dec_armor;
      iVar2 = world::Train::getGoods(local_50);
      if (len < 0x97) {
        dVar7 = ceil((double)local_48 * (double)len);
        iVar3 = world::Town::getArrmorCapacity(local_40);
        if ((iVar2 + iVar1) - (int)dVar7 <= iVar3) goto LAB_0016608c;
      }
    }
    std::
    _Rb_tree<tiger::trains::world::Train_const*,tiger::trains::world::Train_const*,std::_Identity<tiger::trains::world::Train_const*>,std::less<tiger::trains::world::Train_const*>,std::allocator<tiger::trains::world::Train_const*>>
    ::_M_insert_unique<tiger::trains::world::Train_const*const&>(this_01,&local_50);
  }
  return bVar6;
}

Assistant:

bool HomeChecker::needHome(world::Train *train, int len, int homeLen, models::GoodType type)
{
    if (train->getGoods() == 0)
        return false;

    if (goingHomeTrain.count(train) != 0)
        return true;

    const world::Town *homeTown = (world::Town *)train->getPlayer()->getHome();

    if (type == models::GoodType::PRODUCT)
    {
        int predict = homeTown->getProduct() - (int)std::ceil(dec_product*len);
        int maxLen = predict / homeTown->getPopulation();
        int curProduct = train->getGoods();


        if (maxLen < len)
        {
            goingHomeTrain.insert(train);
            return true;
        }


        predict = homeTown->predictProduct(homeLen) -
                  (int)std::ceil(dec_product*len);

        if (curProduct + predict > homeTown->getProductCapacity())
        {
            goingHomeTrain.insert(train);
            return true;
        }

        return false;
    }
    else
    {
        int predict = homeTown->getArrmor() - (int)std::ceil(dec_armor*len);
        int maxLen = 150;
        int curProduct = train->getGoods();

        if (maxLen < len)
        {
            goingHomeTrain.insert(train);
            return true;
        }

        if (curProduct + predict > homeTown->getArrmorCapacity())
        {
            goingHomeTrain.insert(train);
            return true;
        }

        return false;
    }
}